

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

char mpc_input_getc(mpc_input_t *i)

{
  char cVar1;
  int iVar2;
  mpc_input_t *in_RDI;
  char c;
  char local_1;
  
  iVar2 = in_RDI->type;
  if (iVar2 == 0) {
    local_1 = in_RDI->string[(in_RDI->state).pos];
  }
  else if (iVar2 == 1) {
    iVar2 = fgetc((FILE *)in_RDI->file);
    local_1 = (char)iVar2;
  }
  else if (iVar2 == 2) {
    if (in_RDI->buffer == (char *)0x0) {
      iVar2 = getc((FILE *)in_RDI->file);
      local_1 = (char)iVar2;
    }
    else {
      if ((in_RDI->buffer != (char *)0x0) && (iVar2 = mpc_input_buffer_in_range(in_RDI), iVar2 != 0)
         ) {
        cVar1 = mpc_input_buffer_get(in_RDI);
        return cVar1;
      }
      iVar2 = getc((FILE *)in_RDI->file);
      local_1 = (char)iVar2;
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static char mpc_input_getc(mpc_input_t *i) {

  char c = '\0';

  switch (i->type) {

    case MPC_INPUT_STRING: return i->string[i->state.pos];
    case MPC_INPUT_FILE: c = fgetc(i->file); return c;
    case MPC_INPUT_PIPE:

      if (!i->buffer) { c = getc(i->file); return c; }

      if (i->buffer && mpc_input_buffer_in_range(i)) {
        c = mpc_input_buffer_get(i);
        return c;
      } else {
        c = getc(i->file);
        return c;
      }

    default: return c;
  }
}